

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O1

char * parse_http_headers(char *s,char *end,int len,http_message *req)

{
  mg_str *v;
  mg_str *v_00;
  char cVar1;
  int iVar2;
  char *s_00;
  undefined4 extraout_var;
  size_t sVar3;
  size_t sVar4;
  long lVar5;
  bool bVar6;
  
  lVar5 = 0;
  do {
    v = req->header_names + lVar5;
    v_00 = req->header_values + lVar5;
    s_00 = mg_skip(s,end,": ",v);
    s = mg_skip(s_00,end,"\r\n",v_00);
    sVar3 = req->header_values[lVar5].len;
    bVar6 = sVar3 != 0;
    if (bVar6) {
      cVar1 = v_00->p[sVar3 - 1];
      while (cVar1 == ' ') {
        sVar4 = sVar3 - 1;
        v_00->len = sVar4;
        bVar6 = sVar4 != 0;
        if (!bVar6) break;
        cVar1 = v_00->p[sVar3 - 2];
        sVar3 = sVar4;
      }
    }
    bVar6 = (bool)(v->len != 0 & bVar6);
    if (bVar6) {
      iVar2 = mg_ncasecmp(v->p,"Content-Length",0xe);
      sVar3 = CONCAT44(extraout_var,iVar2);
      if (iVar2 == 0) {
        sVar3 = strtoll(v_00->p,(char **)0x0,10);
        (req->body).len = sVar3;
        sVar3 = sVar3 + (long)len;
        (req->message).len = sVar3;
      }
    }
    else {
      sVar3 = 0;
      v_00->p = (char *)0x0;
      v->p = (char *)0x0;
      v_00->len = 0;
      v->len = 0;
    }
    lVar5 = lVar5 + 1;
    if (!(bool)(bVar6 & lVar5 != 0x27)) {
      return (char *)CONCAT71((int7)(sVar3 >> 8),lVar5 != 0x27);
    }
  } while( true );
}

Assistant:

static const char *parse_http_headers(const char *s, const char *end, int len,
                                      struct http_message *req) {
    int i;
    for (i = 0; i < (int) ARRAY_SIZE(req->header_names) - 1; i++) {
        struct mg_str *k = &req->header_names[i], *v = &req->header_values[i];

        s = mg_skip(s, end, ": ", k);
        s = mg_skip(s, end, "\r\n", v);

        while (v->len > 0 && v->p[v->len - 1] == ' ') {
            v->len--; /* Trim trailing spaces in header value */
        }

        if (k->len == 0 || v->len == 0) {
            k->p = v->p = NULL;
            k->len = v->len = 0;
            break;
        }

        if (!mg_ncasecmp(k->p, "Content-Length", 14)) {
            req->body.len = to64(v->p);
            req->message.len = len + req->body.len;
        }
    }

    return s;
}